

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O2

void __thiscall libDAI::MaxPlus::updateMessage(MaxPlus *this,size_t iI)

{
  double dVar1;
  undefined1 auVar2 [16];
  pointer pTVar3;
  pointer pTVar4;
  long lVar5;
  pointer pdVar6;
  double dVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  dVar1 = (this->Props).damping;
  if (1e-05 < dVar1) {
    pTVar3 = (this->_messages).
             super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar4 = (this->_newmessages).
             super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar5 = *(long *)&pTVar3[iI]._p.super__Vector_base<double,_std::allocator<double>_>._M_impl;
    pdVar6 = *(pointer *)
              ((long)&pTVar3[iI]._p.super__Vector_base<double,_std::allocator<double>_>._M_impl + 8)
    ;
    for (lVar8 = 0; (long)pdVar6 - lVar5 >> 3 != lVar8; lVar8 = lVar8 + 1) {
      dVar7 = dVar1 * *(double *)(lVar5 + lVar8 * 8);
      *(double *)(lVar5 + lVar8 * 8) = dVar7;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)(*(long *)&pTVar4[iI]._p.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl + lVar8 * 8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = 1.0 - dVar1;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = dVar7;
      auVar2 = vfmadd231sd_fma(auVar10,auVar9,auVar2);
      *(long *)(lVar5 + lVar8 * 8) = auVar2._0_8_;
    }
    return;
  }
  TProb<double>::operator=
            ((this->_messages).
             super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start + iI,
             (this->_newmessages).
             super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start + iI);
  return;
}

Assistant:

void MaxPlus::updateMessage(size_t iI) {
        if( Props.damping <= 0.00001 )
        {
#if DEBUG_DAMP
            cout << " MaxPlus::updateMessage - No damping" << endl;
#endif            
            _messages[iI] = _newmessages[iI];
        }
        else
        {
            //this does not work correctly for arbitrary numbers
            //_messages[iI] = (_messages[iI] ^ Props.damping) * (_newmessages[iI] ^ (1.0 - Props.damping));
            //rather use regular pointwise multiplication
#if DEBUG_DAMP
            cout << " MaxPlus::updateMessage - using damping, damp factor=" << 
                Props.damping<<"..."<<endl;
            cout << "old messages     " << _messages[iI] << endl;
            cout << "new messages     " << _newmessages[iI] << endl;            
#endif            
            //inlined this code to speed it up (no need to create new 
            //vectors etc.)
            //_messages[iI] = (_messages[iI] * Props.damping) + (_newmessages[iI] * (1.0 - Props.damping));
            Prob & this_message = _messages[iI];
            Prob & new_message = _newmessages[iI];
            double d = Props.damping;
            double nd = 1.0 - d;
            for(size_t i=0; i < this_message.size(); i++)
            {
                this_message[i] *= d;
                this_message[i] += nd * new_message[i];
            }
                 

#if DEBUG_DAMP
            cout << "updated messages " << _messages[iI] << endl;            
#endif            
        }
    }